

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex
          (SubstitutionTreeClauseVariantIndex *this)

{
  ZIArray<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*> *this_00;
  Entry *pEVar1;
  LiteralSubstitutionTree<Indexing::LiteralClause> *pLVar2;
  Clause *pCVar3;
  Clause *pCVar4;
  bool bVar5;
  void **head;
  ulong uVar6;
  ulong n;
  Iterator local_38;
  
  (this->super_ClauseVariantIndex)._vptr_ClauseVariantIndex =
       (_func_int **)&PTR__SubstitutionTreeClauseVariantIndex_00b53888;
  this_00 = &this->_strees;
  uVar6 = (ulong)(uint)(this->_strees).
                       super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
                       _capacity;
  if (uVar6 != 0) {
    n = 0;
    do {
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _capacity <= n) {
        ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                  (&this_00->
                    super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
      }
      if ((this->_strees).super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>.
          _array[n] != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
        if ((this->_strees).
            super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._capacity <= n
           ) {
          ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::expandToFit
                    (&this_00->
                      super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>,n);
        }
        pLVar2 = (this->_strees).
                 super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>._array[n]
        ;
        if (pLVar2 != (LiteralSubstitutionTree<Indexing::LiteralClause> *)0x0) {
          (*(pLVar2->super_LiteralIndexingStructure<Indexing::LiteralClause>).
            _vptr_LiteralIndexingStructure[1])();
        }
      }
      n = n + 1;
    } while (uVar6 != n);
  }
  pCVar3 = (Clause *)this->_emptyClauses;
  while (pCVar4 = pCVar3, pCVar4 != (Clause *)0x0) {
    pCVar3 = *(Clause **)&(pCVar4->super_Unit)._inference;
    if (pCVar4 != (Clause *)0x0) {
      *(undefined8 *)&pCVar4->super_Unit = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar4;
    }
  }
  local_38._base._last = (this->_groundUnits)._afterLast;
  local_38._base._timestamp = (this->_groundUnits)._timestamp;
  local_38._base._next = (this->_groundUnits)._entries;
  while (bVar5 = ::Lib::
                 DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::Iterator::hasNext(&local_38), bVar5) {
    pEVar1 = local_38._base._next + 1;
    pCVar3 = (Clause *)(local_38._base._next)->_val;
    while (pCVar4 = pCVar3, local_38._base._next = pEVar1, pCVar4 != (Clause *)0x0) {
      pCVar3 = *(Clause **)&(pCVar4->super_Unit)._inference;
      if (pCVar4 != (Clause *)0x0) {
        *(undefined8 *)&pCVar4->super_Unit = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pCVar4;
      }
    }
  }
  ::Lib::Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>::~Array
            (&this_00->super_Array<Indexing::LiteralSubstitutionTree<Indexing::LiteralClause>_*>);
  ::Lib::
  DHMap<Kernel::Literal_*,_Lib::List<Kernel::Clause_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
  ~DHMap(&this->_groundUnits);
  return;
}

Assistant:

SubstitutionTreeClauseVariantIndex::~SubstitutionTreeClauseVariantIndex()
{
  unsigned streeArrSz=_strees.size();
  for(unsigned i=0;i<streeArrSz;i++) {
    if(_strees[i]!=0) {
      delete _strees[i];
    }
  }

  ClauseList::destroy(_emptyClauses);

  DHMap<Literal*, ClauseList*>::Iterator it(_groundUnits);
  while (it.hasNext()) {
    ClauseList::destroy(it.next());
  }
}